

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

Vec_Int_t * Iso_ManFinalize(Iso_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  Iso_Obj_t *pIVar5;
  Aig_Obj_t *pAVar6;
  Vec_Int_t *p_00;
  int *piVar7;
  int iVar8;
  
  if (p->nClasses != 0) {
    __assert_fail("p->nClasses == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                  ,0x444,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
  }
  if (p->vClasses->nSize == 0) {
    iVar8 = 0;
    do {
      pVVar1 = p->pAig->vObjs;
      if (pVVar1->nSize <= iVar8) {
        (p->pAig->pConst1->field_5).iData = 0;
        p->vTemp1->nSize = 0;
        p->vTemp2->nSize = 0;
        iVar8 = 0;
        while( true ) {
          pVVar1 = p->pAig->vCis;
          if (pVVar1->nSize <= iVar8) {
            Vec_PtrSort(p->vTemp1,Iso_ObjCompareByData);
            Vec_PtrSort(p->vTemp2,Iso_ObjCompareByData);
            iVar8 = p->pAig->nObjs[2];
            p_00 = (Vec_Int_t *)malloc(0x10);
            iVar3 = 0x10;
            if (0xe < iVar8 - 1U) {
              iVar3 = iVar8;
            }
            p_00->nSize = 0;
            p_00->nCap = iVar3;
            iVar8 = 0;
            if (iVar3 == 0) {
              piVar7 = (int *)0x0;
            }
            else {
              piVar7 = (int *)malloc((long)iVar3 << 2);
            }
            p_00->pArray = piVar7;
            for (; iVar8 < p->vTemp1->nSize; iVar8 = iVar8 + 1) {
              pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vTemp1,iVar8);
              iVar3 = Aig_ObjCioId(pAVar6);
              Vec_IntPush(p_00,iVar3);
            }
            for (iVar8 = 0; iVar8 < p->vTemp2->nSize; iVar8 = iVar8 + 1) {
              pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vTemp2,iVar8);
              iVar3 = Aig_ObjCioId(pAVar6);
              Vec_IntPush(p_00,iVar3);
            }
            return p_00;
          }
          pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,iVar8);
          if ((pAVar6->field_5).iData < 1) break;
          iVar3 = Aig_ObjCioId(pAVar6);
          Vec_PtrPush((&p->vTemp1)[p->pAig->nObjs[2] - p->pAig->nRegs <= iVar3],pAVar6);
          iVar8 = iVar8 + 1;
        }
        __assert_fail("pObj->iData > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                      ,0x457,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
      }
      pvVar4 = Vec_PtrEntry(pVVar1,iVar8);
      if (pvVar4 != (void *)0x0) {
        uVar2 = (uint)*(undefined8 *)((long)pvVar4 + 0x18);
        if (((uVar2 & 7) == 2) || (0xfffffffd < (uVar2 & 7) - 7)) {
          pIVar5 = Iso_ManObj(p,*(int *)((long)pvVar4 + 0x24));
          iVar3 = pIVar5->Id;
          *(int *)((long)pvVar4 + 0x28) = iVar3;
          if (iVar3 < 1) {
            __assert_fail("pObj->iData > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                          ,0x44f,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
          }
        }
        else {
          *(undefined4 *)((long)pvVar4 + 0x28) = 0xffffffff;
        }
      }
      iVar8 = iVar8 + 1;
    } while( true );
  }
  __assert_fail("Vec_PtrSize(p->vClasses) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigIsoSlow.c"
                ,0x445,"Vec_Int_t *Iso_ManFinalize(Iso_Man_t *)");
}

Assistant:

Vec_Int_t * Iso_ManFinalize( Iso_Man_t * p )
{
    Vec_Int_t * vRes;
    Aig_Obj_t * pObj;
    int i;
    assert( p->nClasses == 0 );
    assert( Vec_PtrSize(p->vClasses) == 0 );
    // set canonical numbers
    Aig_ManForEachObj( p->pAig, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
        {
            pObj->iData = -1;
            continue;
        }
        pObj->iData = Iso_ManObj(p, Aig_ObjId(pObj))->Id;
        assert( pObj->iData > 0 );
    }
    Aig_ManConst1(p->pAig)->iData = 0;
    // assign unique IDs to the CIs
    Vec_PtrClear( p->vTemp1 );
    Vec_PtrClear( p->vTemp2 );
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        assert( pObj->iData > 0 );
        if ( Aig_ObjCioId(pObj) >= Aig_ManCiNum(p->pAig) - Aig_ManRegNum(p->pAig) ) // flop
            Vec_PtrPush( p->vTemp2, pObj );
        else // PI
            Vec_PtrPush( p->vTemp1, pObj );
    }
    // sort CIs by their IDs
    Vec_PtrSort( p->vTemp1, (int (*)(void))Iso_ObjCompareByData );
    Vec_PtrSort( p->vTemp2, (int (*)(void))Iso_ObjCompareByData );
    // create the result
    vRes = Vec_IntAlloc( Aig_ManCiNum(p->pAig) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTemp1, pObj, i )
        Vec_IntPush( vRes, Aig_ObjCioId(pObj) );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vTemp2, pObj, i )
        Vec_IntPush( vRes, Aig_ObjCioId(pObj) );
    return vRes;
}